

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O1

void strbuf_append_string(strbuf_t *s,char *str)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if (*str != '\0') {
    iVar2 = ~s->length + s->size;
    pcVar3 = str + 1;
    do {
      if (iVar2 < 1) {
        strbuf_resize(s,s->length + 1);
        iVar2 = ~s->length + s->size;
      }
      s->buf[s->length] = pcVar3[-1];
      s->length = s->length + 1;
      iVar2 = iVar2 + -1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void strbuf_append_string(strbuf_t *s, const char *str)
{
    int space, i;

    space = strbuf_empty_length(s);

    for (i = 0; str[i]; i++) {
        if (space < 1) {
            strbuf_resize(s, s->length + 1);
            space = strbuf_empty_length(s);
        }

        s->buf[s->length] = str[i];
        s->length++;
        space--;
    }
}